

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstandardpaths.cpp
# Opt level: O0

QString * QStandardPaths::locate(StandardLocation type,QString *fileName,LocateOptions options)

{
  bool bVar1;
  const_iterator o;
  QString *in_RDI;
  long in_FS_OFFSET;
  QStringBuilder<const_QString_&,_char16_t> QVar2;
  QStringList *dirs;
  QString *path;
  const_iterator dir;
  QStringBuilder<QStringBuilder<const_QString_&,_char16_t>,_const_QString_&>
  *in_stack_ffffffffffffff08;
  QStringBuilder<const_QString_&,_char16_t> *in_stack_ffffffffffffff10;
  undefined5 in_stack_ffffffffffffff18;
  undefined1 in_stack_ffffffffffffff1d;
  char16_t in_stack_ffffffffffffff1e;
  QString *path_00;
  QFlagsStorage<QStandardPaths::LocateOption> in_stack_ffffffffffffff5c;
  StandardLocation in_stack_ffffffffffffffa4;
  const_iterator local_58 [5];
  QString *local_30;
  char16_t local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  path_00 = in_RDI;
  standardLocations(in_stack_ffffffffffffffa4);
  local_58[0].i = (QString *)&DAT_aaaaaaaaaaaaaaaa;
  local_58[0] = QList<QString>::constBegin((QList<QString> *)in_stack_ffffffffffffff10);
  while( true ) {
    o = QList<QString>::constEnd((QList<QString> *)in_stack_ffffffffffffff10);
    bVar1 = QList<QString>::const_iterator::operator!=(local_58,o);
    if (!bVar1) break;
    (path_00->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    (path_00->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    (path_00->d).ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    QList<QString>::const_iterator::operator*(local_58);
    QVar2 = ::operator+((QString *)
                        CONCAT26(in_stack_ffffffffffffff1e,
                                 CONCAT15(in_stack_ffffffffffffff1d,in_stack_ffffffffffffff18)),
                        (char16_t *)in_stack_ffffffffffffff10);
    local_30 = QVar2.a;
    in_stack_ffffffffffffff1e = QVar2.b;
    local_28 = in_stack_ffffffffffffff1e;
    ::operator+(in_stack_ffffffffffffff10,(QString *)in_stack_ffffffffffffff08);
    ::QStringBuilder::operator_cast_to_QString(in_stack_ffffffffffffff08);
    in_stack_ffffffffffffff1d =
         existsAsSpecified(path_00,(LocateOptions)in_stack_ffffffffffffff5c.i);
    if ((bool)in_stack_ffffffffffffff1d) goto LAB_002f1656;
    QString::~QString((QString *)0x2f1624);
    QList<QString>::const_iterator::operator++(local_58);
  }
  QString::QString((QString *)0x2f164e);
LAB_002f1656:
  QList<QString>::~QList((QList<QString> *)0x2f1663);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QString QStandardPaths::locate(StandardLocation type, const QString &fileName, LocateOptions options)
{
    const QStringList &dirs = standardLocations(type);
    for (QStringList::const_iterator dir = dirs.constBegin(); dir != dirs.constEnd(); ++dir) {
        const QString path = *dir + u'/' + fileName;
        if (existsAsSpecified(path, options))
            return path;
    }
    return QString();
}